

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
node::anon_unknown_2::ChainImpl::handleNotifications
          (ChainImpl *this,shared_ptr<interfaces::Chain::Notifications> notifications)

{
  ValidationSignals *pVVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *puVar4;
  _func_int **pp_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long in_FS_OFFSET;
  shared_ptr<CValidationInterface> callbacks;
  element_type local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  long local_38;
  
  _Var6 = notifications.
          super___shared_ptr<interfaces::Chain::Notifications,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = inline_assertion_check<true,std::unique_ptr<ValidationSignals,std::default_delete<ValidationSignals>>&>
                     ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
                      (notifications.
                       super___shared_ptr<interfaces::Chain::Notifications,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr[1]._vptr_Notifications + 0x1c),
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/interfaces.cpp"
                      ,0x362,"validation_signals","m_node.validation_signals");
  pVVar1 = (puVar4->_M_t).
           super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
           super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
           super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl;
  pp_Var5 = (_func_int **)operator_new(0x20);
  pp_Var2 = (_Var6._M_pi)->_vptr__Sp_counted_base;
  pp_Var3 = *(_func_int ***)&(_Var6._M_pi)->_M_use_count;
  (_Var6._M_pi)->_vptr__Sp_counted_base = (_func_int **)0x0;
  (_Var6._M_pi)->_M_use_count = 0;
  (_Var6._M_pi)->_M_weak_count = 0;
  *pp_Var5 = (_func_int *)&PTR__NotificationsHandlerImpl_013b6390;
  pp_Var5[1] = (_func_int *)pVVar1;
  pp_Var5[2] = (_func_int *)0x0;
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  local_40->_M_use_count = 1;
  local_40->_M_weak_count = 1;
  local_40->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_013b63d0;
  local_48._vptr_CValidationInterface = (_func_int **)(local_40 + 1);
  local_40[1]._vptr__Sp_counted_base = (_func_int **)&PTR_UpdatedBlockTip_013b6420;
  *(_func_int ***)&local_40[1]._M_use_count = pp_Var2;
  local_40[2]._vptr__Sp_counted_base = pp_Var3;
  pp_Var5[3] = (_func_int *)local_40;
  pp_Var5[2] = (_func_int *)local_48._vptr_CValidationInterface;
  pVVar1 = (ValidationSignals *)pp_Var5[1];
  if (__libc_single_threaded == '\0') {
    LOCK();
    local_40->_M_use_count = local_40->_M_use_count + 1;
    UNLOCK();
  }
  else {
    local_40->_M_use_count = 2;
  }
  callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_UpdatedBlockTip_013b6420;
  callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_48;
  ValidationSignals::RegisterSharedValidationInterface(pVVar1,callbacks);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  (this->super_Chain)._vptr_Chain = pp_Var5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleNotifications(std::shared_ptr<Notifications> notifications) override
    {
        return std::make_unique<NotificationsHandlerImpl>(validation_signals(), std::move(notifications));
    }